

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_yv12_copy_y_c(YV12_BUFFER_CONFIG *src_ybc,YV12_BUFFER_CONFIG *dst_ybc,int use_crop)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  uint16_t *dst16;
  uint16_t *src16;
  uint8_t *dst;
  uint8_t *src;
  int height;
  int width;
  int row;
  int local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  int local_18;
  
  if (in_EDX == 0) {
    iVar1 = *in_RDI;
    local_48 = in_RDI[2];
  }
  else {
    iVar1 = in_RDI[4];
    local_48 = in_RDI[6];
  }
  local_28 = *(void **)(in_RDI + 10);
  local_30 = *(void **)(in_RSI + 0x28);
  if ((in_RDI[0x30] & 8U) == 0) {
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      memcpy(local_30,local_28,(long)iVar1);
      local_28 = (void *)((long)local_28 + (long)in_RDI[8]);
      local_30 = (void *)((long)local_30 + (long)*(int *)(in_RSI + 0x20));
    }
  }
  else {
    local_38 = (void *)((long)local_28 << 1);
    local_40 = (void *)((long)local_30 << 1);
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      memcpy(local_40,local_38,(long)iVar1 << 1);
      local_38 = (void *)((long)local_38 + (long)in_RDI[8] * 2);
      local_40 = (void *)((long)local_40 + (long)*(int *)(in_RSI + 0x20) * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_copy_y_c(const YV12_BUFFER_CONFIG *src_ybc,
                       YV12_BUFFER_CONFIG *dst_ybc, int use_crop) {
  int row;
  int width = use_crop ? src_ybc->y_crop_width : src_ybc->y_width;
  int height = use_crop ? src_ybc->y_crop_height : src_ybc->y_height;
  const uint8_t *src = src_ybc->y_buffer;
  uint8_t *dst = dst_ybc->y_buffer;

#if CONFIG_AV1_HIGHBITDEPTH
  if (src_ybc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
    for (row = 0; row < height; ++row) {
      memcpy(dst16, src16, width * sizeof(uint16_t));
      src16 += src_ybc->y_stride;
      dst16 += dst_ybc->y_stride;
    }
    return;
  }
#endif

  for (row = 0; row < height; ++row) {
    memcpy(dst, src, width);
    src += src_ybc->y_stride;
    dst += dst_ybc->y_stride;
  }
}